

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

bool __thiscall ArmParser::matchSymbol(ArmParser *this,Parser *parser,char symbol,bool optional)

{
  bool bVar1;
  TokenType type;
  int iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = (int)CONCAT71(in_register_00000011,symbol);
  if (iVar2 < 0x3d) {
    if (iVar2 < 0x2b) {
      if (iVar2 == 0x21) {
        type = Exclamation;
      }
      else {
        if (iVar2 != 0x23) {
          return false;
        }
        type = Hash;
      }
    }
    else if (iVar2 == 0x2b) {
      type = Plus;
    }
    else {
      if (iVar2 != 0x2c) {
        return false;
      }
      type = Comma;
    }
  }
  else if (iVar2 < 0x5d) {
    if (iVar2 == 0x3d) {
      type = Assign;
    }
    else {
      type = LBrack;
      if (iVar2 != 0x5b) {
        return false;
      }
    }
  }
  else if (iVar2 == 0x7d) {
    type = RBrace;
  }
  else if (iVar2 == 0x7b) {
    type = LBrace;
  }
  else {
    if (iVar2 != 0x5d) {
      return false;
    }
    type = RBrack;
  }
  bVar1 = Parser::matchToken(parser,type,optional);
  return bVar1;
}

Assistant:

bool ArmParser::matchSymbol(Parser& parser, char symbol, bool optional)
{
	switch (symbol)
	{
	case '[':
		return parser.matchToken(TokenType::LBrack,optional);
	case ']':
		return parser.matchToken(TokenType::RBrack,optional);
	case ',':
		return parser.matchToken(TokenType::Comma,optional);
	case '!':
		return parser.matchToken(TokenType::Exclamation,optional);
	case '{':
		return parser.matchToken(TokenType::LBrace,optional);
	case '}':
		return parser.matchToken(TokenType::RBrace,optional);
	case '#':
		return parser.matchToken(TokenType::Hash,optional);
	case '=':
		return parser.matchToken(TokenType::Assign,optional);
	case '+':
		return parser.matchToken(TokenType::Plus,optional);
	}

	return false;
}